

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

parser_error parser_parse(parser *p,char *line)

{
  _Bool _Var1;
  undefined4 uVar2;
  ushort **ppuVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  parser_hook *local_68;
  char *z_1;
  char *z;
  char *pcStack_50;
  wchar_t t;
  char *sp;
  parser_value *v;
  parser_spec *s;
  parser_hook *h;
  char *tok;
  char *cline;
  char *line_local;
  parser *p_local;
  
  pcStack_50 = (char *)0x0;
  cline = line;
  line_local = (char *)p;
  if (p == (parser *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/parser.c"
                  ,0xda,"enum parser_error parser_parse(struct parser *, const char *)");
  }
  if (line == (char *)0x0) {
    __assert_fail("line",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/parser.c"
                  ,0xdb,"enum parser_error parser_parse(struct parser *, const char *)");
  }
  parser_freeold(p);
  *(int *)(line_local + 4) = *(int *)(line_local + 4) + 1;
  line_local[8] = '\x01';
  line_local[9] = '\0';
  line_local[10] = '\0';
  line_local[0xb] = '\0';
  line_local[0x418] = '\0';
  line_local[0x419] = '\0';
  line_local[0x41a] = '\0';
  line_local[0x41b] = '\0';
  line_local[0x41c] = '\0';
  line_local[0x41d] = '\0';
  line_local[0x41e] = '\0';
  line_local[0x41f] = '\0';
  line_local[0x420] = '\0';
  line_local[0x421] = '\0';
  line_local[0x422] = '\0';
  line_local[0x423] = '\0';
  line_local[0x424] = '\0';
  line_local[0x425] = '\0';
  line_local[0x426] = '\0';
  line_local[0x427] = '\0';
  while( true ) {
    bVar7 = false;
    if (*cline != '\0') {
      ppuVar3 = __ctype_b_loc();
      bVar7 = ((*ppuVar3)[(int)*cline] & 0x2000) != 0;
    }
    if (!bVar7) break;
    cline = cline + 1;
  }
  if ((*cline == '\0') || (*cline == '#')) {
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    tok = string_make(cline);
    h = (parser_hook *)strtok(tok,":");
    if (h == (parser_hook *)0x0) {
      mem_free(tok);
      line_local[0] = ' ';
      line_local[1] = '\0';
      line_local[2] = '\0';
      line_local[3] = '\0';
      p_local._4_4_ = PARSE_ERROR_MISSING_FIELD;
    }
    else {
      s = (parser_spec *)findhook((parser *)line_local,(char *)h);
      if ((parser_hook *)s == (parser_hook *)0x0) {
        my_strcpy(line_local + 0xc,(char *)h,0x400);
        line_local[0] = '5';
        line_local[1] = '\0';
        line_local[2] = '\0';
        line_local[3] = '\0';
        mem_free(tok);
        p_local._4_4_ = PARSE_ERROR_UNDEFINED_DIRECTIVE;
      }
      else {
        for (v = (parser_value *)((parser_hook *)s)->fhead; v != (parser_value *)0x0;
            v = (parser_value *)(v->spec).next) {
          z._4_4_ = (v->spec).type & 0xfffffffe;
          *(int *)(line_local + 8) = *(int *)(line_local + 8) + 1;
          if ((((z._4_4_ == 2) || (z._4_4_ == 4)) || (z._4_4_ == 8)) || (z._4_4_ == 10)) {
            h = (parser_hook *)strtok(pcStack_50,":");
            pcStack_50 = (char *)0x0;
          }
          else if (z._4_4_ == 0xc) {
            h = (parser_hook *)strtok(pcStack_50,"");
            if ((h != (parser_hook *)0x0) &&
               (pcStack_50 = utf8_fskip((char *)h,1,(char *)0x0), pcStack_50 != (char *)0x0)) {
              if (*pcStack_50 == ':') {
                pcStack_50 = pcStack_50 + 1;
              }
              else if (*pcStack_50 != '\0') {
                my_strcpy(line_local + 0xc,(v->spec).name,0x400);
                line_local[0] = '\x03';
                line_local[1] = '\0';
                line_local[2] = '\0';
                line_local[3] = '\0';
                mem_free(tok);
                return PARSE_ERROR_FIELD_TOO_LONG;
              }
            }
          }
          else {
            h = (parser_hook *)strtok(pcStack_50,"");
            pcStack_50 = (char *)0x0;
          }
          if (h == (parser_hook *)0x0) {
            if (((v->spec).type & 1U) == 0) {
              my_strcpy(line_local + 0xc,(v->spec).name,0x400);
              line_local[0] = ' ';
              line_local[1] = '\0';
              line_local[2] = '\0';
              line_local[3] = '\0';
              mem_free(tok);
              return PARSE_ERROR_MISSING_FIELD;
            }
            break;
          }
          sp = (char *)mem_alloc(0x28);
          sp[0] = '\0';
          sp[1] = '\0';
          sp[2] = '\0';
          sp[3] = '\0';
          sp[4] = '\0';
          sp[5] = '\0';
          sp[6] = '\0';
          sp[7] = '\0';
          *(int *)(sp + 8) = (v->spec).type;
          *(char **)(sp + 0x10) = (v->spec).name;
          if (z._4_4_ == 2) {
            z_1 = (char *)0x0;
            lVar4 = strtol((char *)h,&z_1,0);
            *(int *)(sp + 0x18) = (int)lVar4;
            if ((parser_hook *)z_1 == h) {
              mem_free(sp);
              mem_free(tok);
              my_strcpy(line_local + 0xc,(v->spec).name,0x400);
              line_local[0] = '+';
              line_local[1] = '\0';
              line_local[2] = '\0';
              line_local[3] = '\0';
              return PARSE_ERROR_NOT_NUMBER;
            }
          }
          else if (z._4_4_ == 10) {
            local_68 = (parser_hook *)0x0;
            uVar5 = strtoul((char *)h,(char **)&local_68,0);
            *(int *)(sp + 0x18) = (int)uVar5;
            if ((local_68 == h) || (*(char *)&h->next == '-')) {
              mem_free(sp);
              mem_free(tok);
              my_strcpy(line_local + 0xc,(v->spec).name,0x400);
              line_local[0] = '+';
              line_local[1] = '\0';
              line_local[2] = '\0';
              line_local[3] = '\0';
              return PARSE_ERROR_NOT_NUMBER;
            }
          }
          else if (z._4_4_ == 0xc) {
            text_mbstowcs((wchar_t *)(sp + 0x18),(char *)h,L'\x01');
          }
          else if ((z._4_4_ == 4) || (z._4_4_ == 6)) {
            pcVar6 = string_make((char *)h);
            *(char **)(sp + 0x18) = pcVar6;
          }
          else if ((z._4_4_ == 8) &&
                  (_Var1 = parse_random((char *)h,(random_value_conflict *)(sp + 0x18)), !_Var1)) {
            mem_free(sp);
            mem_free(tok);
            my_strcpy(line_local + 0xc,(v->spec).name,0x400);
            line_local[0] = ',';
            line_local[1] = '\0';
            line_local[2] = '\0';
            line_local[3] = '\0';
            return PARSE_ERROR_NOT_RANDOM;
          }
          if (*(long *)(line_local + 0x418) == 0) {
            *(char **)(line_local + 0x418) = sp;
          }
          else {
            **(undefined8 **)(line_local + 0x420) = sp;
          }
          *(char **)(line_local + 0x420) = sp;
        }
        mem_free(tok);
        uVar2 = (**(code **)&s->type)(line_local);
        *(undefined4 *)line_local = uVar2;
        p_local._4_4_ = *(parser_error *)line_local;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

enum parser_error parser_parse(struct parser *p, const char *line) {
	char *cline;
	char *tok;
	struct parser_hook *h;
	struct parser_spec *s;
	struct parser_value *v;
	char *sp = NULL;

	assert(p);
	assert(line);

	parser_freeold(p);

	p->lineno++;
	p->colno = 1;
	p->fhead = NULL;
	p->ftail = NULL;

	/* Ignore empty lines and comments. */
	while (*line && (isspace(*line)))
		line++;
	if (!*line || *line == '#')
		return PARSE_ERROR_NONE;

	cline = string_make(line);

	tok = strtok(cline, ":");
	if (!tok) {
		mem_free(cline);
		p->error = PARSE_ERROR_MISSING_FIELD;
		return PARSE_ERROR_MISSING_FIELD;
	}

	h = findhook(p, tok);
	if (!h) {
		my_strcpy(p->errmsg, tok, sizeof(p->errmsg));
		p->error = PARSE_ERROR_UNDEFINED_DIRECTIVE;
		mem_free(cline);
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}

	/* There's a little bit of trickiness here to account for optional
	 * types. The optional flag has a bit assigned to it in the spec's type
	 * tag; we compute a temporary type for the spec with that flag removed
	 * and use that instead. */
	for (s = h->fhead; s; s = s->next) {
		int t = s->type & ~PARSE_T_OPT;
		p->colno++;

		/* These types are tokenized on ':'; strings are not tokenized
		 * at all (i.e., they consume the remainder of the line) */
		if (t == PARSE_T_INT || t == PARSE_T_SYM || t == PARSE_T_RAND ||
			t == PARSE_T_UINT) {
			tok = strtok(sp, ":");
			sp = NULL;
		} else if (t == PARSE_T_CHAR) {
			tok = strtok(sp, "");
			if (tok) {
				sp = utf8_fskip(tok, 1, NULL);
				if (sp) {
					if (*sp == ':') {
						++sp;
					} else if (*sp) {
						my_strcpy(p->errmsg, s->name,
							sizeof(p->errmsg));
						p->error = PARSE_ERROR_FIELD_TOO_LONG;
						mem_free(cline);
						return PARSE_ERROR_FIELD_TOO_LONG;
					}
				}
			}
		} else {
			tok = strtok(sp, "");
			sp = NULL;
		}
		if (!tok) {
			if (!(s->type & PARSE_T_OPT)) {
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_MISSING_FIELD;
				mem_free(cline);
				return PARSE_ERROR_MISSING_FIELD;
			}
			break;
		}

		/* Allocate a value node. */
		v = mem_alloc(sizeof *v);
		v->spec.next = NULL;
		v->spec.type = s->type;
		v->spec.name = s->name;

		/* Parse out its value. */
		if (t == PARSE_T_INT) {
			char *z = NULL;
			v->u.ival = strtol(tok, &z, 0);
			if (z == tok) {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_NUMBER;
				return PARSE_ERROR_NOT_NUMBER;
			}
		} else if (t == PARSE_T_UINT) {
			char *z = NULL;
			v->u.uval = strtoul(tok, &z, 0);
			if (z == tok || *tok == '-') {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_NUMBER;
				return PARSE_ERROR_NOT_NUMBER;
			}
		} else if (t == PARSE_T_CHAR) {
			text_mbstowcs(&v->u.cval, tok, 1);
		} else if (t == PARSE_T_SYM || t == PARSE_T_STR) {
			v->u.sval = string_make(tok);
		} else if (t == PARSE_T_RAND) {
			if (!parse_random(tok, &v->u.rval)) {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_RANDOM;
				return PARSE_ERROR_NOT_RANDOM;
			}
		}

		/* Link it into the value list. */
		if (!p->fhead)
			p->fhead = v;
		else
			p->ftail->spec.next = &v->spec;
		p->ftail = v;
	}

	mem_free(cline);

	p->error = h->func(p);
	return p->error;
}